

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

String * __thiscall
glcts::LayoutBindingBaseCase::buildAccess
          (String *__return_storage_ptr__,LayoutBindingBaseCase *this,String *var)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  undefined4 extraout_var_00;
  undefined1 local_198 [8];
  ostringstream s;
  String *var_local;
  LayoutBindingBaseCase *this_local;
  
  s._368_8_ = var;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
  poVar2 = std::operator<<((ostream *)local_198,*(char **)(CONCAT44(extraout_var,iVar1) + 0x28));
  poVar2 = std::operator<<(poVar2,"(");
  poVar2 = std::operator<<(poVar2,(string *)s._368_8_);
  poVar2 = std::operator<<(poVar2,",");
  iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
  poVar2 = std::operator<<(poVar2,*(char **)(CONCAT44(extraout_var_00,iVar1) + 0x20));
  poVar2 = std::operator<<(poVar2,"(0)");
  std::operator<<(poVar2,")");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return __return_storage_ptr__;
}

Assistant:

virtual String buildAccess(const String& var)
	{
		std::ostringstream s;
		s << getTestParameters().access_function << "(" << var << "," << getTestParameters().coord_vector_type << "(0)"
		  << ")";
		return s.str();
	}